

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::DebugString
          (FieldDescriptor *this,int depth,PrintLabelFlag print_label_flag,string *contents,
          DebugStringOptions *debug_string_options)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  long lVar3;
  FieldDescriptor *pFVar4;
  size_t sVar5;
  string local_330;
  string formatted_options;
  string prefix;
  string field_type;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  string local_208;
  SourceLocationCommentPrinter comment_printer;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  field_type._M_dataplus._M_p = (pointer)&field_type.field_2;
  field_type._M_string_length = 0;
  field_type.field_2._M_local_buf[0] = '\0';
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    comment_printer._0_8_ = TypeOnceInit;
    formatted_options._M_dataplus._M_p = (pointer)this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&comment_printer,
               (FieldDescriptor **)&formatted_options);
  }
  if ((*(int *)(this + 0x38) == 0xb) &&
     (lVar3 = *(long *)(this + 0x68), *(char *)(*(long *)(lVar3 + 0x20) + 0x4b) == '\x01')) {
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      formatted_options._M_dataplus._M_p = (pointer)this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)&formatted_options);
      lVar3 = *(long *)(this + 0x68);
    }
    FieldTypeNameDebugString_abi_cxx11_((string *)&local_298,*(FieldDescriptor **)(lVar3 + 0x28));
    comment_printer._0_8_ = local_298.text_;
    comment_printer.source_loc_.start_line = local_298.size_;
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_238.text_ = (char *)this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)&local_238);
    }
    FieldTypeNameDebugString_abi_cxx11_
              (&local_330,(FieldDescriptor *)(*(long *)(*(long *)(this + 0x68) + 0x28) + 0x98));
    formatted_options._M_dataplus._M_p = local_330._M_dataplus._M_p;
    formatted_options._M_string_length =
         CONCAT44(formatted_options._M_string_length._4_4_,(int)local_330._M_string_length);
    local_238.text_ = (char *)0x0;
    local_238.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_268.text_ = (char *)0x0;
    local_268.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    strings::SubstituteAndAppend
              (&field_type,"map<$0, $1>",(SubstituteArg *)&comment_printer,
               (SubstituteArg *)&formatted_options,&local_238,&local_120,&local_f0,&local_268,
               &local_150,&local_60,&local_90,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if (local_298.text_ != local_298.scratch_ + 4) {
LAB_002ccda8:
      operator_delete(local_298.text_);
    }
  }
  else {
    FieldTypeNameDebugString_abi_cxx11_((string *)&comment_printer,this);
    std::__cxx11::string::operator=((string *)&field_type,(string *)&comment_printer);
    local_298.text_ = (char *)comment_printer._0_8_;
    if ((int *)comment_printer._0_8_ != &comment_printer.source_loc_.start_column)
    goto LAB_002ccda8;
  }
  if ((*(int *)(this + 0x3c) == 1) &&
     ((print_label_flag == OMIT_LABEL || (*(int *)(*(long *)(this + 0x28) + 0x3c) == 3)))) {
LAB_002cce11:
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    local_330._M_string_length = 0;
    local_330.field_2._M_local_buf[0] = '\0';
  }
  else {
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      comment_printer._0_8_ = TypeOnceInit;
      formatted_options._M_dataplus._M_p = (pointer)this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&comment_printer,
                 (FieldDescriptor **)&formatted_options);
    }
    if ((*(int *)(this + 0x38) == 0xb) &&
       (*(char *)(*(long *)(*(long *)(this + 0x68) + 0x20) + 0x4b) == '\x01')) goto LAB_002cce11;
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    local_330._M_string_length = 0;
    local_330.field_2._M_local_buf[0] = '\0';
    __s = *(char **)(kLabelToName + (ulong)*(uint *)(this + 0x3c) * 8);
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_330,0,(char *)0x0,(ulong)__s);
    std::__cxx11::string::push_back((char)&local_330);
  }
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&comment_printer.prefix_,prefix._M_dataplus._M_p,
             prefix._M_dataplus._M_p +
             CONCAT44(prefix._M_string_length._4_4_,(undefined4)prefix._M_string_length));
  if (debug_string_options->include_comments == true) {
    bVar1 = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    bVar1 = false;
  }
  comment_printer.have_source_loc_ = bVar1;
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  formatted_options._M_dataplus = prefix._M_dataplus;
  formatted_options._M_string_length =
       CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)prefix._M_string_length);
  local_238.text_ = local_330._M_dataplus._M_p;
  local_238.size_ = (int)local_330._M_string_length;
  local_120.text_ = field_type._M_dataplus._M_p;
  local_120.size_ = (int)field_type._M_string_length;
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_268.text_ = (char *)TypeOnceInit;
    local_150.text_ = (char *)this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&local_268,
               (FieldDescriptor **)&local_150);
  }
  pFVar4 = this;
  if (*(int *)(this + 0x38) == 10) {
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_268.text_ = (char *)this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)&local_268);
    }
    pFVar4 = *(FieldDescriptor **)(this + 0x68);
  }
  local_f0.text_ = (char *)**(undefined8 **)pFVar4;
  local_f0.size_ = *(int *)(*(undefined8 **)pFVar4 + 1);
  local_268.text_ = FastInt32ToBuffer(*(int32 *)(this + 0x44),local_268.scratch_);
  sVar5 = strlen(local_268.text_);
  local_268.size_ = (int)sVar5;
  local_150.text_ = (char *)0x0;
  local_150.size_ = -1;
  local_60.text_ = (char *)0x0;
  local_60.size_ = -1;
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_298.text_ = (char *)0x0;
  local_298.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0$1$2 $3 = $4",(SubstituteArg *)&formatted_options,&local_238,&local_120,
             &local_f0,&local_268,&local_150,&local_60,&local_90,&local_c0,&local_298);
  if (this[0x40] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&local_208,this,true);
    formatted_options._M_dataplus._M_p = local_208._M_dataplus._M_p;
    formatted_options._M_string_length =
         CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)local_208._M_string_length);
    local_238.text_ = (char *)0x0;
    local_238.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_268.text_ = (char *)0x0;
    local_268.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_298.text_ = (char *)0x0;
    local_298.size_ = -1;
    strings::SubstituteAndAppend
              (contents," [default = $0",(SubstituteArg *)&formatted_options,&local_238,&local_120,
               &local_f0,&local_268,&local_150,&local_60,&local_90,&local_c0,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (this[0x41] == (FieldDescriptor)0x1) {
    if (bVar1) {
      std::__cxx11::string::append((char *)contents);
    }
    else {
      bVar1 = true;
      std::__cxx11::string::append((char *)contents);
    }
    std::__cxx11::string::append((char *)contents);
    CEscape(&formatted_options,*(string **)(this + 0x20));
    std::__cxx11::string::_M_append((char *)contents,(ulong)formatted_options._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)formatted_options._M_dataplus._M_p != &formatted_options.field_2) {
      operator_delete(formatted_options._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)contents);
  }
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  bVar2 = anon_unknown_1::FormatBracketedOptions
                    (depth,*(Message **)(this + 0x78),
                     *(DescriptorPool **)(*(long *)(this + 0x28) + 0x10),&formatted_options);
  if (bVar2) {
    std::__cxx11::string::append((char *)contents);
    std::__cxx11::string::_M_append((char *)contents,(ulong)formatted_options._M_dataplus._M_p);
  }
  else if (!bVar1) goto LAB_002cd2a3;
  std::__cxx11::string::append((char *)contents);
LAB_002cd2a3:
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_238.text_ = (char *)TypeOnceInit;
    local_120.text_ = (char *)this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&local_238,
               (FieldDescriptor **)&local_120);
  }
  if ((*(int *)(this + 0x38) == 10) && (debug_string_options->elide_group_body == false)) {
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_238.text_ = (char *)this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)&local_238);
    }
    Descriptor::DebugString(*(Descriptor **)(this + 0x68),depth,contents,debug_string_options,false)
    ;
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)formatted_options._M_dataplus._M_p != &formatted_options.field_2) {
    operator_delete(formatted_options._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.leading_comments.field_2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_type._M_dataplus._M_p != &field_type.field_2) {
    operator_delete(field_type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FieldDescriptor::DebugString(
    int depth, PrintLabelFlag print_label_flag, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  std::string field_type;

  // Special case map fields.
  if (is_map()) {
    strings::SubstituteAndAppend(
        &field_type, "map<$0, $1>",
        message_type()->field(0)->FieldTypeNameDebugString(),
        message_type()->field(1)->FieldTypeNameDebugString());
  } else {
    field_type = FieldTypeNameDebugString();
  }

  bool print_label = true;
  // Determine whether to omit label:
  //   1. For an optional field, omit label if it's in oneof or in proto3.
  //   2. For a repeated field, omit label if it's a map.
  if (is_optional() && (print_label_flag == OMIT_LABEL ||
                        file()->syntax() == FileDescriptor::SYNTAX_PROTO3)) {
    print_label = false;
  } else if (is_map()) {
    print_label = false;
  }
  std::string label;
  if (print_label) {
    label = kLabelToName[this->label()];
    label.push_back(' ');
  }

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(
      contents, "$0$1$2 $3 = $4", prefix, label, field_type,
      type() == TYPE_GROUP ? message_type()->name() : name(), number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    strings::SubstituteAndAppend(contents, " [default = $0",
                                 DefaultValueAsString(true));
  }
  if (has_json_name_) {
    if (!bracketed) {
      bracketed = true;
      contents->append("[");
    } else {
      contents->append(", ");
    }
    contents->append("json_name = \"");
    contents->append(CEscape(json_name()));
    contents->append("\"");
  }

  std::string formatted_options;
  if (FormatBracketedOptions(depth, options(), file()->pool(),
                             &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (type() == TYPE_GROUP) {
    if (debug_string_options.elide_group_body) {
      contents->append(" { ... };\n");
    } else {
      message_type()->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ false);
    }
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}